

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O3

void test_bson_json_read_corrupt_utf8(void)

{
  long lVar1;
  char *pcVar2;
  undefined8 uVar3;
  int *__haystack;
  int size;
  bson_error_t error;
  undefined1 auStack_220 [16];
  code *pcStack_210;
  int local_208;
  int local_204;
  char local_200 [504];
  
  __haystack = &local_208;
  pcStack_210 = (code *)0x130d25;
  memset(&local_208,0,0x200);
  pcStack_210 = (code *)0x130d3b;
  lVar1 = bson_new_from_json(anon_var_dwarf_1a50a,0xffffffffffffffff,&local_208);
  if (lVar1 == 0) {
    __haystack = &local_208;
    if (local_208 != 1) goto LAB_00130dbd;
    __haystack = &local_208;
    if (local_204 != 1) goto LAB_00130dc2;
    __haystack = (int *)local_200;
    pcStack_210 = (code *)0x130d65;
    pcVar2 = strstr((char *)__haystack,"invalid bytes in UTF8 string");
    if (pcVar2 == (char *)0x0) goto LAB_00130dc7;
    pcStack_210 = (code *)0x130d80;
    lVar1 = bson_new_from_json(anon_var_dwarf_1a516,0xffffffffffffffff,&local_208);
    if (lVar1 != 0) goto LAB_00130db8;
    if (local_208 != 1) goto LAB_00130dcf;
    if (local_204 == 1) {
      pcStack_210 = (code *)0x130da5;
      pcVar2 = strstr((char *)__haystack,"invalid bytes in UTF8 string");
      if (pcVar2 != (char *)0x0) {
        return;
      }
      goto LAB_00130dd9;
    }
  }
  else {
    pcStack_210 = (code *)0x130db8;
    test_bson_json_read_corrupt_utf8_cold_1();
LAB_00130db8:
    pcStack_210 = (code *)0x130dbd;
    test_bson_json_read_corrupt_utf8_cold_4();
LAB_00130dbd:
    pcStack_210 = (code *)0x130dc2;
    test_bson_json_read_corrupt_utf8_cold_2();
LAB_00130dc2:
    pcStack_210 = (code *)0x130dc7;
    test_bson_json_read_corrupt_utf8_cold_3();
LAB_00130dc7:
    pcStack_210 = (code *)0x130dcf;
    test_bson_json_read_corrupt_utf8_cold_8();
LAB_00130dcf:
    pcStack_210 = (code *)0x130dd4;
    test_bson_json_read_corrupt_utf8_cold_5();
  }
  pcStack_210 = (code *)0x130dd9;
  test_bson_json_read_corrupt_utf8_cold_6();
LAB_00130dd9:
  pcStack_210 = test_bson_json_read_decimal128;
  test_bson_json_read_corrupt_utf8_cold_7();
  pcStack_210 = (code *)__haystack;
  bson_decimal128_from_string("123.5",auStack_220);
  uVar3 = bson_bcon_magic();
  size = 0x14ca78;
  uVar3 = bcon_new(0,"decimal",uVar3,0x12,auStack_220,0);
  _test_bson_json_read_compare("{ \"decimal\" : { \"$numberDecimal\" : \"123.5\" }}",size,uVar3,0);
  return;
}

Assistant:

static void
test_bson_json_read_corrupt_utf8 (void)
{
   const char *bad_key = "{ \"\x80\" : \"a\"}";
   const char *bad_value = "{ \"a\" : \"\x80\"}";
   bson_error_t error = {0};

   BSON_ASSERT (!bson_new_from_json ((uint8_t *) bad_key, -1, &error));
   ASSERT_ERROR_CONTAINS (error,
                          BSON_ERROR_JSON,
                          BSON_JSON_ERROR_READ_CORRUPT_JS,
                          "invalid bytes in UTF8 string");

   BSON_ASSERT (!bson_new_from_json ((uint8_t *) bad_value, -1, &error));
   ASSERT_ERROR_CONTAINS (error,
                          BSON_ERROR_JSON,
                          BSON_JSON_ERROR_READ_CORRUPT_JS,
                          "invalid bytes in UTF8 string");
}